

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

_Bool MatrixSetElement(Matrix *a,uint32_t rows,uint32_t columns,Real value)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = a->rows;
  uVar2 = a->columns;
  if (columns < uVar2 && rows < uVar1) {
    *(unkbyte10 *)(a->matrix + (uVar2 * rows + columns)) = value._0_10_;
  }
  else {
    fprintf(_stderr,"%s: Invalid element indices (rows:%d<%d, columns:%d<%d)\n","MatrixSetElement");
  }
  return columns < uVar2 && rows < uVar1;
}

Assistant:

bool MatrixSetElement(Matrix *a, uint32_t rows, uint32_t columns, Real value) {
#ifndef NDEBUG
  if (a->rows <= rows || a->columns <= columns) {
    fprintf(stderr, "%s: Invalid element indices (rows:%d<%d, columns:%d<%d)\n", __FUNCTION_NAME__, rows, a->rows, columns, a->columns);
    return false;
  }
#endif
  a->matrix[columns + a->columns * rows] = value;
  return true;
}